

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

value_type __thiscall
jsoncons::jsonpath::detail::
ends_with_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(ends_with_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong __n;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined1 uVar7;
  string_view_type sVar8;
  string_view_type sVar9;
  string_view_type sVar10;
  string_view_type sVar11;
  value_type vVar12;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> bStack_48;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> local_38;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish == 0) {
    if (*pcVar1 == '\0') {
      pbVar5 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8)
      ;
    }
    else {
      pbVar5 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
    }
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              (&local_38,pbVar5);
    bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      (&local_38);
    if (bVar3) {
      lVar2 = *(long *)ec;
      if (*(char *)(lVar2 + 0x18) == '\0') {
        pbVar5 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                  (lVar2 + 0x20);
      }
      else {
        pbVar5 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 (lVar2 + 0x20);
      }
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                (&bStack_48,pbVar5);
      bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        (&bStack_48);
      if (bVar3) {
        sVar8 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                          (&local_38);
        sVar9 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                          (&local_38);
        sVar10 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           (&bStack_48);
        sVar11 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           (&bStack_48);
        __n = sVar11._M_len;
        if ((sVar9._M_len < __n) ||
           ((uVar7 = 1, __n != 0 &&
            (iVar4 = wmemcmp(sVar10._M_str,sVar8._M_str + (sVar9._M_len - __n),__n), iVar4 != 0))))
        {
          uVar7 = 0;
        }
        *(undefined2 *)
         &(this->
          super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          )._vptr_function_base = 1;
        *(undefined1 *)
         ((long)&(this->
                 super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 )._vptr_function_base + 2) = uVar7;
      }
      else {
        std::error_code::operator=(in_RCX,invalid_type);
        pbVar5 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                   pbVar5);
      }
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&bStack_48);
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar5 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5)
      ;
    }
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_38);
    uVar6 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar5 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5);
    uVar6 = extraout_RDX;
  }
  vVar12.field_0.int64_.val_ = uVar6;
  vVar12.field_0._0_8_ = this;
  return (value_type)vVar12.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_string())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            auto arg1= args[1].value();
            if (!arg1.is_string())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            auto sv0 = arg0.template as<string_view_type>();
            auto sv1 = arg1.template as<string_view_type>();

            if (sv1.length() <= sv0.length() && sv1 == sv0.substr(sv0.length() - sv1.length()))
            {
                return value_type(true, semantic_tag::none);
            }
            return value_type(false, semantic_tag::none);
        }